

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Socket::makeBlock(Socket *this,bool enabled)

{
  uint uVar1;
  int iVar2;
  int flags;
  bool enabled_local;
  Socket *this_local;
  
  uVar1 = fcntl(this->_fd,3,0);
  if ((int)uVar1 < 0) {
    this_local._7_1_ = false;
  }
  else {
    if (enabled) {
      iVar2 = fcntl(this->_fd,4,(ulong)(uVar1 & 0xfffff7ff));
      if (iVar2 == -1) {
        return false;
      }
    }
    else {
      iVar2 = fcntl(this->_fd,4,(ulong)(uVar1 | 0x800));
      if (iVar2 == -1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Socket::makeBlock( bool enabled )
{
#ifdef _WIN32
    u_long nonblocking = enabled ? 0 : 1;
    if (::ioctlsocket(_fd, FIONBIO, &nonblocking) == SOCKET_ERROR) {
        return false;
    }
#else
    int flags;
    if ((flags = ::fcntl(_fd, F_GETFL, NULL)) < 0) {
        return false;
    }
    if(enabled)
    {
        if (::fcntl(_fd, F_SETFL, flags & ~O_NONBLOCK) == -1) {
            return false;
        }
    }
    else
    {
        if (::fcntl(_fd, F_SETFL, flags | O_NONBLOCK) == -1) {
            return false;
        }
    }
#endif
    return true;
}